

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::IntFromDescriptor
          (ChMatterMeshless *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  pointer psVar1;
  uint uVar2;
  ulong start;
  ChVectorRef local_80;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  start = (ulong)off_v;
  uVar2 = 0;
  while( true ) {
    psVar1 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)uVar2) break;
    ChVariables::Get_qb(&local_80,
                        &((psVar1[uVar2].
                           super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->variables).super_ChVariables);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&v->super_ChVectorDynamic<double>,start,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_80
              );
    uVar2 = uVar2 + 1;
    start = (ulong)((int)start + 3);
  }
  return;
}

Assistant:

void ChMatterMeshless::IntFromDescriptor(const unsigned int off_v,
                                         ChStateDelta& v,
                                         const unsigned int off_L,
                                         ChVectorDynamic<>& L) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        v.segment(off_v + 3 * j, 3) = nodes[j]->variables.Get_qb();
    }
}